

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence::IfcAnnotationTextOccurrence
          (IfcAnnotationTextOccurrence *this)

{
  *(undefined ***)&(this->super_IfcAnnotationOccurrence).field_0x90 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcAnnotationTextOccurrence";
  IfcAnnotationOccurrence::IfcAnnotationOccurrence
            (&this->super_IfcAnnotationOccurrence,&PTR_construction_vtable_24__00866400);
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x866348;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x8663e8;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x866370;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = 0x866398;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = 0x8663c0;
  return;
}

Assistant:

IfcAnnotationTextOccurrence() : Object("IfcAnnotationTextOccurrence") {}